

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_utilities.hpp
# Opt level: O0

void __thiscall
Disa::Convergence_Data::update<Disa::Matrix_Sparse,Disa::Vector_Dense<double,0ul>>
          (Convergence_Data *this,Matrix_Sparse *coef,Vector_Dense<double,_0UL> *solution,
          Vector_Dense<double,_0UL> *constant)

{
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> _Var1;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_60;
  duration<long,_std::ratio<1L,_1000000000L>_> local_58 [2];
  tuple<double&,double&> local_48 [16];
  pair<double,_double> local_38;
  Vector_Dense<double,_0UL> *local_28;
  Vector_Dense<double,_0UL> *constant_local;
  Vector_Dense<double,_0UL> *solution_local;
  Matrix_Sparse *coef_local;
  Convergence_Data *this_local;
  
  local_28 = constant;
  constant_local = solution;
  solution_local = (Vector_Dense<double,_0UL> *)coef;
  coef_local = (Matrix_Sparse *)this;
  local_38 = compute_residual<Disa::Matrix_Sparse,Disa::Vector_Dense<double,0ul>>
                       (coef,solution,constant);
  std::tie<double,double>((double *)local_48,&this->residual);
  std::tuple<double&,double&>::operator=(local_48,&local_38);
  if (this->iteration == 0) {
    this->residual_0 = this->residual;
    this->residual_max_0 = this->residual_max;
  }
  this->residual_normalised = this->residual / this->residual_0;
  this->residual_max_normalised = this->residual_max / this->residual_max_0;
  this->iteration = this->iteration + 1;
  local_60.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_58[0].__r = (rep)std::chrono::operator-(&local_60,&this->start_time);
  _Var1 = std::chrono::
          duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                    (local_58);
  (this->duration).__r = _Var1.__r;
  return;
}

Assistant:

void Convergence_Data::update(const _matrix& coef, const _vector& solution, const _vector& constant) {

  std::tie(residual, residual_max) = compute_residual(coef, solution, constant);

  if(!iteration) {
    residual_0 = residual;
    residual_max_0 = residual_max;
  }
  residual_normalised = residual / residual_0;
  residual_max_normalised = residual_max / residual_max_0;

  ++iteration;
  duration = std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::steady_clock::now() - start_time);
}